

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgDetectECP(uint portAdr)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 local_18;
  uint err;
  uchar cnfgB;
  uchar cnfgA;
  uint uStack_c;
  uchar pv;
  uint portAdr_local;
  
  ZvgIO.ecpDcr = portAdr + 2;
  ZvgIO.ecpDsr = portAdr + 1;
  ZvgIO.ecpEcr = portAdr + 0x402;
  ZvgIO.ecpEcpDFifo = portAdr + 0x400;
  ZvgIO.ecpFlags = 0;
  ZvgIO.ecpPort = portAdr;
  ZvgIO.ecpData = portAdr;
  iVar4 = iopl(3);
  if (iVar4 == 0) {
    bVar2 = inb((unsigned_short)ZvgIO.ecpEcr);
    if (bVar2) {
      outb(true,(unsigned_short)ZvgIO.ecpEcr);
      bVar2 = inb((unsigned_short)ZvgIO.ecpEcr);
      if (bVar2 == true) {
        outb(true,(unsigned_short)ZvgIO.ecpEcr);
        sVar1 = (short)portAdr;
        bVar2 = inb(sVar1 + 0x400);
        inb(sVar1 + 0x401);
        outb((bool)(bVar2 | 0x10U),sVar1 + 0x400);
        bVar3 = inb(sVar1 + 0x400);
        local_18 = 0;
        if (bVar3 != (bool)(bVar2 | 0x10U)) {
          local_18 = 0x11;
        }
        outb(true,(unsigned_short)ZvgIO.ecpEcr);
        wdcr('\a');
        uStack_c = local_18;
      }
      else {
        uStack_c = 8;
      }
    }
    else {
      uStack_c = 8;
    }
  }
  else {
    uStack_c = 1;
  }
  return uStack_c;
}

Assistant:

uint zvgDetectECP( uint portAdr)
{
	uchar		pv, cnfgA, cnfgB;
	uint		err;

	err = errOk;

	// setup port addresses

	ZvgIO.ecpPort = portAdr;
	ZvgIO.ecpData = portAdr + ECP_data;
	ZvgIO.ecpDcr = portAdr + ECP_dcr;
	ZvgIO.ecpDsr = portAdr + ECP_dsr;
	ZvgIO.ecpEcr = portAdr + ECP_ecr;
	ZvgIO.ecpEcpDFifo = portAdr + ECP_ecpDFifo;

	// Reset all ECP flags

	ZvgIO.ecpFlags = 0;

	// Claim port access
	err = iopl(3);
	if (err)
	{
		return(1);
	}
	// look for ECP port

	pv = inportb( ZvgIO.ecpEcr);

	// Check that the full bit is off, and the empty bit is set

	if (!((pv & (ECR_full | ECR_empty)) == ECR_empty))
		return (errNotEcp);

	// verify that we cannot change the empty bit to a zero 

	outportb( ZvgIO.ecpEcr, 0x34);				// write 0x34

	if (inportb( ZvgIO.ecpEcr) != 0x35)			// verify 0x35 is read back
		return (errNotEcp);

	// gain access to the configuration registers

	outportb( ZvgIO.ecpEcr, ECR_Cnfg_mode | ECR_nErrIntrEn | ECR_serviceIntr);

	// read the configuration registers

	cnfgA = inportb( portAdr + ECP_cnfgA);
	cnfgB = inportb( portAdr + ECP_cnfgB);

	// Check the size of the data word being transferred

	if ((cnfgA & 0x60) != 0x10)
	{
		// if not set to 8 bit mode, try to set it

		cnfgA &= 0x9F;												// remove word size bits
		cnfgA |= 0x10;												// set to 8 bit words

		outportb( portAdr + ECP_cnfgA, cnfgA);

		// if not writeable, error

		if (inportb( portAdr + ECP_cnfgA) != cnfgA)
			err = errEcpWord;
	}

	// set port to SPP mode

	outportb( ZvgIO.ecpEcr, ECR_SPP_mode | ECR_nErrIntrEn | ECR_serviceIntr);

	// Set the flags to compatibility mode:
	//
	//    nSelectIn - Low
	//    nAutoFeed - High
	//    nStrobe   - High
	//    nInit     - High
	//
	// Also set are:
	//
	//    Direction - Low (buffers are enabled for writing to peripheral)
	//    ackIntEn  - Low (nAck interrupts are disabled)

	wdcr( DCR_nAutoFeed | DCR_nStrobe | DCR_nInit);

	return (err);
}